

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool ON_IntersectViewFrustumPlane
               (ON_Viewport *vp,ON_PlaneEquation *plane_equation,ON_SimpleArray<ON_3dPoint> *points)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ON_SimpleArray<ON_3dPoint> *this;
  bool bVar5;
  ON_3dPoint *pOVar6;
  ulong uVar7;
  uint uVar8;
  ON_2dVector *pOVar9;
  double *t;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  ON_2dVector OVar21;
  ON_3dPoint local_7f0;
  ON_SimpleArray<ON_3dPoint> *local_7d8;
  double local_7d0;
  double local_7c8;
  double local_7c0;
  double local_7b8;
  ON_3dPoint local_7b0;
  ON_3dPoint local_798;
  ON_3dVector local_780;
  ON_3dVector local_768;
  ON_3dVector local_750;
  ON_3dVector Y;
  ON_3dVector X;
  ON_3dPoint C;
  ON_3dVector Z;
  ON_3dPoint P;
  ON_3dPoint P1;
  ON_3dPoint P0;
  ON_PgonPt ppt;
  ON_3dPoint F [8];
  double v [8];
  ON_Plane plane;
  ON_3dPoint local_4b8;
  ON_2dVector OStack_4a0;
  undefined8 uStack_490;
  undefined1 local_488 [24];
  ON_2dVector local_470 [3];
  ON_2dVector local_440 [65];
  
  C.z = (vp->m_CamLoc).z;
  C.x = (vp->m_CamLoc).x;
  C.y = (vp->m_CamLoc).y;
  X.z = (vp->m_CamX).z;
  X.x = (vp->m_CamX).x;
  X.y = (vp->m_CamX).y;
  Y.z = (vp->m_CamY).z;
  Y.x = (vp->m_CamY).x;
  Y.y = (vp->m_CamY).y;
  plane.origin.z = (vp->m_CamZ).z;
  plane.origin.x = (vp->m_CamZ).x;
  plane.origin.y = (vp->m_CamZ).y;
  ON_3dVector::operator-(&Z,(ON_3dVector *)&plane);
  if ((vp->m_bValidCamera == true) && (vp->m_bValidFrustum == true)) {
    dVar19 = vp->m_frus_left;
    local_7d8 = (ON_SimpleArray<ON_3dPoint> *)vp->m_frus_right;
    dVar20 = vp->m_frus_bottom;
    local_7b8 = vp->m_frus_top;
    local_7c0 = vp->m_frus_near;
    local_7c8 = vp->m_frus_far;
    ON_Plane::ON_Plane(&plane,plane_equation);
    bVar5 = ON_Plane::IsValid(&plane);
    if (bVar5) {
      if (vp->m_projection == perspective_view) {
        local_7d0 = local_7c8 / local_7c0;
      }
      else {
        local_7d0 = 1.0;
      }
      operator*(&local_750,dVar19,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      operator*(&local_768,dVar20,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[0].z = local_7f0.z;
      F[0].x = local_7f0.x;
      F[0].y = local_7f0.y;
      operator*(&local_750,(double)local_7d8,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      operator*(&local_768,dVar20,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[1].z = local_7f0.z;
      F[1].x = local_7f0.x;
      F[1].y = local_7f0.y;
      operator*(&local_750,(double)local_7d8,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      operator*(&local_768,local_7b8,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[2].z = local_7f0.z;
      F[2].x = local_7f0.x;
      F[2].y = local_7f0.y;
      operator*(&local_750,dVar19,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      operator*(&local_768,local_7b8,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c0,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[3].z = local_7f0.z;
      F[3].x = local_7f0.x;
      F[3].y = local_7f0.y;
      dVar19 = dVar19 * local_7d0;
      operator*(&local_750,dVar19,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      dVar20 = dVar20 * local_7d0;
      operator*(&local_768,dVar20,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[4].z = local_7f0.z;
      F[4].x = local_7f0.x;
      F[4].y = local_7f0.y;
      local_7d8 = (ON_SimpleArray<ON_3dPoint> *)((double)local_7d8 * local_7d0);
      operator*(&local_750,(double)local_7d8,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      operator*(&local_768,dVar20,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[5].z = local_7f0.z;
      F[5].x = local_7f0.x;
      F[5].y = local_7f0.y;
      operator*(&local_750,(double)local_7d8,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      local_7b8 = local_7b8 * local_7d0;
      operator*(&local_768,local_7b8,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      F[6].z = local_7f0.z;
      F[6].x = local_7f0.x;
      F[6].y = local_7f0.y;
      operator*(&local_750,dVar19,&X);
      ON_3dPoint::operator+(&local_7b0,&C,&local_750);
      operator*(&local_768,local_7b8,&Y);
      ON_3dPoint::operator+(&local_798,&local_7b0,&local_768);
      operator*(&local_780,local_7c8,&Z);
      ON_3dPoint::operator+(&local_7f0,&local_798,&local_780);
      pOVar6 = F;
      F[7].z = local_7f0.z;
      F[7].x = local_7f0.x;
      F[7].y = local_7f0.y;
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        dVar19 = ON_PlaneEquation::ValueAt(plane_equation,*pOVar6);
        v[lVar14] = dVar19;
        pOVar6 = pOVar6 + 1;
      }
      uVar13 = 0;
      local_7d8 = points;
      for (lVar14 = 0; lVar14 != 0xc; lVar14 = lVar14 + 1) {
        iVar10 = (&DAT_006e2930)[lVar14 * 2];
        dVar19 = v[iVar10];
        iVar1 = (&DAT_006e2934)[lVar14 * 2];
        dVar20 = v[iVar1];
        P0.x = F[iVar10].x;
        P0.y = F[iVar10].y;
        P0.z = F[iVar10].z;
        P1.x = F[iVar1].x;
        P1.y = F[iVar1].y;
        P1.z = F[iVar1].z;
        if (((dVar19 <= 0.0) && (0.0 <= dVar20)) || ((0.0 <= dVar19 && (dVar20 <= 0.0)))) {
          if ((dVar19 != dVar20) || (NAN(dVar19) || NAN(dVar20))) {
            dVar20 = dVar20 / (dVar20 - dVar19);
            operator*(&local_798,dVar20,&P0);
            operator*(&local_7b0,1.0 - dVar20,&P1);
            ON_3dPoint::operator+(&local_7f0,&local_798,&local_7b0);
            P.z = local_7f0.z;
            P.x = local_7f0.x;
            P.y = local_7f0.y;
            iVar10 = 1;
            pOVar6 = &P;
            uVar8 = uVar13;
          }
          else {
            pOVar6 = F + iVar1;
            lVar12 = (long)(int)uVar13;
            (&local_4b8)[lVar12 * 2].z = F[iVar10].z;
            dVar19 = F[iVar10].y;
            (&local_4b8)[lVar12 * 2].x = F[iVar10].x;
            (&local_4b8)[lVar12 * 2].y = dVar19;
            iVar10 = 2;
            uVar8 = uVar13 + 1;
          }
          uVar13 = uVar13 + iVar10;
          lVar12 = (long)(int)uVar8;
          (&local_4b8)[lVar12 * 2].z = pOVar6->z;
          dVar19 = pOVar6->y;
          (&local_4b8)[lVar12 * 2].x = pOVar6->x;
          (&local_4b8)[lVar12 * 2].y = dVar19;
        }
      }
      if (0 < (int)uVar13) {
        uVar7 = (ulong)uVar13;
        t = &OStack_4a0.y;
        iVar10 = 0;
        for (uVar11 = 0; this = local_7d8, lVar14 = (long)iVar10, uVar7 != uVar11;
            uVar11 = uVar11 + 1) {
          pOVar9 = (ON_2dVector *)(t + -1);
          ON_Plane::ClosestPointTo(&plane,*(ON_3dPoint *)(t + -4),(double *)pOVar9,t);
          dVar19 = *t;
          dVar20 = (&OStack_4a0)[lVar14 * 3].y;
          if ((dVar19 < dVar20) ||
             (((dVar19 == dVar20 && (!NAN(dVar19) && !NAN(dVar20))) &&
              (pOVar9->x <= (&OStack_4a0)[lVar14 * 3].x && (&OStack_4a0)[lVar14 * 3].x != pOVar9->x)
              ))) {
            iVar10 = (int)uVar11;
          }
          t = t + 6;
        }
        dVar19 = (&local_4b8)[lVar14 * 2].x;
        dVar20 = (&local_4b8)[lVar14 * 2].y;
        dVar2 = (&local_4b8)[lVar14 * 2].z;
        dVar3 = (&OStack_4a0)[lVar14 * 3].x;
        dVar4 = (&OStack_4a0)[lVar14 * 3].y;
        if (iVar10 != 0) {
          (&OStack_4a0)[lVar14 * 3].y = OStack_4a0.y;
          *(undefined8 *)(local_488 + lVar14 * 0x30 + -8) = uStack_490;
          (&local_4b8)[lVar14 * 2].z = local_4b8.z;
          (&OStack_4a0)[lVar14 * 3].x = OStack_4a0.x;
          (&local_4b8)[lVar14 * 2].x = local_4b8.x;
          (&local_4b8)[lVar14 * 2].y = local_4b8.y;
          local_4b8.x = dVar19;
          local_4b8.y = dVar20;
          local_4b8.z = dVar2;
          OStack_4a0.x = dVar3;
          OStack_4a0.y = dVar4;
        }
        uStack_490 = 0xffefffffffffffff;
        pOVar9 = local_470;
        for (uVar11 = 1; uVar11 < uVar7; uVar11 = uVar11 + 1) {
          dVar19 = pOVar9->x - OStack_4a0.x;
          dVar20 = pOVar9->y - OStack_4a0.y;
          pOVar9->x = dVar19;
          pOVar9->y = dVar20;
          pOVar9[1].x = (double)(~-(ulong)(0.0 < dVar20) & 0xffefffffffffffff |
                                (ulong)(-dVar19 / dVar20) & -(ulong)(0.0 < dVar20));
          pOVar9 = pOVar9 + 3;
        }
        OStack_4a0.x = 0.0;
        OStack_4a0.y = 0.0;
        ON_qsort(local_488,(ulong)(uVar13 - 1),0x30,comparePptAngle);
        ON_SimpleArray<ON_3dPoint>::Append(this,&local_4b8);
        OVar21 = ON_2dVector::operator-(local_470,&OStack_4a0);
        uVar17 = OVar21.y._0_4_;
        uVar18 = OVar21.y._4_4_;
        uVar15 = OVar21.x._0_4_;
        uVar16 = OVar21.x._4_4_;
        iVar10 = 0;
        pOVar9 = local_440;
        lVar14 = 0x100000000;
        for (uVar11 = 2; uVar11 < uVar7; uVar11 = uVar11 + 1) {
          lVar12 = (long)iVar10;
          if ((double)CONCAT44(uVar18,uVar17) * (pOVar9->x - (&OStack_4a0)[lVar12 * 3].x) <
              (double)CONCAT44(uVar16,uVar15) * (pOVar9->y - (&OStack_4a0)[lVar12 * 3].y)) {
            ON_SimpleArray<ON_3dPoint>::Append(this,(ON_3dPoint *)&pOVar9[-5].y);
            iVar10 = (int)uVar11 + -1;
            lVar12 = lVar14 >> 0x20;
          }
          OVar21 = ON_2dVector::operator-(pOVar9,&OStack_4a0 + lVar12 * 3);
          uVar17 = OVar21.y._0_4_;
          uVar18 = OVar21.y._4_4_;
          uVar15 = OVar21.x._0_4_;
          uVar16 = OVar21.x._4_4_;
          pOVar9 = pOVar9 + 3;
          lVar14 = lVar14 + 0x100000000;
        }
        if (iVar10 < (int)uVar11 + -1) {
          ON_SimpleArray<ON_3dPoint>::Append(this,(ON_3dPoint *)&pOVar9[-5].y);
        }
      }
    }
    ON_Plane::~ON_Plane(&plane);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_IntersectViewFrustumPlane( 
    const ON_Viewport& vp,
    const ON_PlaneEquation& plane_equation, 
    ON_SimpleArray<ON_3dPoint>& points 
    )
{

  double left, right, bottom, top, near_dist, far_dist;
  double v[8], v0, v1, s;
  ON_PgonPt ppt, ppt_list[24];
  ON_3dPoint F[8], P0, P1, P;
  ON_2dVector D;
  const ON_3dPoint  C = vp.CameraLocation();
  const ON_3dVector X = vp.CameraX();
  const ON_3dVector Y = vp.CameraY();
  const ON_3dVector Z = -vp.CameraZ();
  int e[12][2] = {{0,1},{1,2},{2,3},{3,0},
                  {4,5},{5,6},{6,7},{7,4},
                  {0,4},{1,5},{2,6},{3,7}};
  int i, i0, i1;
  int ppt_count = 0;

  if ( !vp.IsValidCamera() || !vp.GetFrustum(&left,&right,&bottom,&top,&near_dist,&far_dist) )
    return false;

  const ON_Plane plane(plane_equation);
  if ( !plane.IsValid() )
    return false;

  s = ON::perspective_view == vp.Projection() 
    ? far_dist/near_dist
    : 1.0;
  F[0] = C + left*X  + bottom*Y + near_dist*Z;
  F[1] = C + right*X + bottom*Y + near_dist*Z;
  F[2] = C + right*X + top*Y    + near_dist*Z;
  F[3] = C + left*X  + top*Y    + near_dist*Z;

  F[4] = C + s*left*X  + s*bottom*Y + far_dist*Z;
  F[5] = C + s*right*X + s*bottom*Y + far_dist*Z;
  F[6] = C + s*right*X + s*top*Y    + far_dist*Z;
  F[7] = C + s*left*X  + s*top*Y    + far_dist*Z;

  for ( i = 0; i < 8; i++ )
  {
    v[i] = plane_equation.ValueAt(F[i]);
  }

  for ( i = 0; i < 12; i++ )
  {
    v0 = v[e[i][0]];
    v1 = v[e[i][1]];
    P0 = F[e[i][0]];
    P1 = F[e[i][1]];
    if ( (v0 <= 0.0 && v1 >= 0.0) || (v0 >= 0.0 && v1 <= 0.0) )
    {
      if ( v0 == v1 )
      {
        ppt_list[ppt_count++].m_P = P0;
        ppt_list[ppt_count++].m_P = P1;
      }
      else
      {
        s = v1/(v1-v0);
        P = s*P0 + (1.0-s)*P1;
        ppt_list[ppt_count++].m_P = P;
      }
    }
  }

  if ( ppt_count <= 0 )
    return true; // plane misses frustum

  i0 = 0;
  for ( i = 0; i < ppt_count; i++ )
  {
    plane.ClosestPointTo( ppt_list[i].m_P, &ppt_list[i].m_Q.x, &ppt_list[i].m_Q.y );
    if (     ppt_list[i].m_Q.y < ppt_list[i0].m_Q.y 
         || (ppt_list[i].m_Q.y == ppt_list[i0].m_Q.y && ppt_list[i].m_Q.x < ppt_list[i0].m_Q.x) )
      i0 = i;
  }

  // Use Gram scan to get the convex hull and save it in points[].
  // See http://en.wikipedia.org/wiki/Graham_scan for details.

  // put point with smallest m_Q.y coordinate in ppt_list[0].
  ppt = ppt_list[i0];
  if ( i0 )
  {
    ppt_list[i0] = ppt_list[0];
    ppt_list[0] = ppt;
    i0 = 0;
  }

  // sort points by the angle (ppt_list[i].m_Q = ppt_list[0].m_Q) makes
  // with the positive x axis.  This is the same as sorting them by
  // -cot(angle) = -deltax/deltay.
  ppt_list[0].m_negcotangle = -ON_DBL_MAX; // -cot(0) = - infinity
  for ( i = 1; i < ppt_count; i++ )
  {
    ppt_list[i].m_Q.x -= ppt_list[0].m_Q.x;
    ppt_list[i].m_Q.y -= ppt_list[0].m_Q.y;
    ppt_list[i].m_negcotangle = (0.0 >= ppt_list[i].m_Q.y) ? -ON_DBL_MAX : -ppt_list[i].m_Q.x/ppt_list[i].m_Q.y;
  }
  ppt_list[0].m_Q.x = 0.0;
  ppt_list[0].m_Q.y = 0.0;
  ON_qsort(ppt_list+1,ppt_count-1,sizeof(ppt_list[0]),comparePptAngle);

  points.Append(ppt_list[0].m_P);
  i0 = 0;
  i1 = 1;
  D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;

  for ( i = 2; i < ppt_count; i++ )
  {
    if ( (ppt_list[i].m_Q.y - ppt_list[i0].m_Q.y)*D.x <= (ppt_list[i].m_Q.x - ppt_list[i0].m_Q.x)*D.y )
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "right" turn or collinear.
      // Drop ppt_list[i1].
      i1 = i;
    }
    else
    {
      // ppt_list[i0], ppt_list[i1], ppt_list[i] is a "left" turn.
      points.Append(ppt_list[i1].m_P);
      i0 = i1;
      i1 = i;
    }
    D = ppt_list[i1].m_Q - ppt_list[i0].m_Q;
  }

  if ( i1 > i0 )
    points.Append(ppt_list[i1].m_P);

  return true;
}